

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64rd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a)

{
  ulong uVar1;
  int *piVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int_t iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  undefined8 local_108;
  undefined8 local_100;
  int local_f8 [50];
  
  iVar14 = 0;
  if (0 < *n) {
    iVar14 = *n;
  }
  local_100 = 1;
  do {
    do {
      if (local_100 == iVar14 + 1) {
        return 0;
      }
      uVar1 = local_100 + 1;
      iVar4 = ip[local_100 - 1];
      iVar5 = ip[local_100];
      local_100 = uVar1;
    } while (iVar5 - iVar4 < 2);
    if (0xe < (uint)(iVar5 - iVar4)) {
      local_f8[0] = iVar4;
      local_f8[1] = iVar5;
      iVar11 = 2;
      do {
        lVar15 = (long)iVar11;
        lVar13 = lVar15 + -2;
        local_108 = (int *)((long)&local_100 + lVar15 * 4);
        iVar7 = *local_108;
        piVar2 = (int *)((long)&local_100 + lVar15 * 4 + 4);
        iVar8 = *piVar2;
        dVar19 = a[(long)((iVar8 + iVar7) / 2) + -1];
        lVar16 = (long)iVar7;
        lVar12 = lVar16;
        do {
          if (iVar8 <= lVar12) goto LAB_001113fb;
          dVar3 = a[lVar12 + -1];
          lVar12 = lVar12 + 1;
        } while ((dVar3 == dVar19) && (!NAN(dVar3) && !NAN(dVar19)));
        iVar10 = iVar7;
        if (dVar3 <= dVar19) {
          dVar19 = dVar3;
        }
        for (; lVar16 < iVar8; lVar16 = lVar16 + 1) {
          if (dVar19 < a[lVar16 + -1]) {
            dVar3 = a[(long)iVar10 + -1];
            a[(long)iVar10 + -1] = a[lVar16 + -1];
            a[lVar16 + -1] = dVar3;
            iVar6 = irn[(long)iVar10 + -1];
            irn[(long)iVar10 + -1] = irn[lVar16 + -1];
            irn[lVar16 + -1] = iVar6;
            iVar10 = iVar10 + 1;
          }
        }
        iVar9 = iVar10;
        if (iVar8 - iVar10 <= iVar10 - iVar7) {
          local_108 = piVar2;
          iVar9 = iVar8;
          iVar7 = iVar10;
        }
        local_f8[lVar15 + 1] = iVar9;
        local_f8[lVar15] = iVar7;
        *local_108 = iVar10;
        lVar13 = (long)(iVar11 + 2);
LAB_001113fb:
        lVar12 = 2;
        do {
          if (lVar13 + lVar12 == 2) goto LAB_00111291;
          lVar16 = lVar12 * 4;
          lVar15 = lVar12 * 4;
          lVar12 = lVar12 + -2;
        } while (*(int *)((long)&local_108 + lVar16 + lVar13 * 4 + 4) -
                 *(int *)((long)&local_108 + lVar15 + lVar13 * 4) < 0xf);
        iVar11 = (int)lVar13 + (int)lVar12;
      } while( true );
    }
LAB_00111291:
    lVar16 = (long)iVar4;
    lVar12 = lVar16 << 0x20;
    lVar13 = lVar16;
    while (lVar15 = lVar13 + 1, lVar15 < iVar5) {
      dVar19 = a[lVar13];
      if (a[lVar13 + -1] < dVar19) {
        iVar6 = irn[lVar13];
        a[lVar13] = a[lVar13 + -1];
        irn[lVar13] = irn[lVar13 + -1];
        lVar17 = lVar12;
        for (; lVar18 = lVar16, lVar16 < lVar13; lVar13 = lVar13 + -1) {
          if (dVar19 <= a[lVar13 + -2]) {
            lVar18 = lVar17 >> 0x20;
            break;
          }
          a[lVar13 + -1] = a[lVar13 + -2];
          irn[lVar13 + -1] = irn[lVar13 + -2];
          lVar17 = lVar17 + -0x100000000;
        }
        a[lVar18 + -1] = dVar19;
        irn[lVar18 + -1] = iVar6;
      }
      lVar12 = lVar12 + 0x100000000;
      lVar13 = lVar15;
    }
  } while( true );
}

Assistant:

int_t mc64rd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;

    /* Local variables */
    int_t j, k, r__, s;
    double ha;
    int_t hi, td, mid, len, ipj;
    double key;
    int_t last, todo[50], first;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* This subroutine sorts the entries in each column of the */
/* sparse matrix (defined by N,NE,IP,IRN,A) by decreasing */
/* numerical value. */
/* Local constants */
/* Local variables */
/* Local arrays */
    /* Parameter adjustments */
    --ip;
    --a;
    --irn;

    /* Function Body */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	len = ip[j + 1] - ip[j];
	if (len <= 1) {
	    goto L100;
	}
	ipj = ip[j];
/* Sort array roughly with partial quicksort */
	if (len < 15) {
	    goto L400;
	}
	todo[0] = ipj;
	todo[1] = ipj + len;
	td = 2;
L500:
	first = todo[td - 2];
	last = todo[td - 1];
/* KEY is the smallest of two values present in interval [FIRST,LAST) */
	key = a[(first + last) / 2];
	i__2 = last - 1;
	for (k = first; k <= i__2; ++k) {
	    ha = a[k];
	    if (ha == key) {
		goto L475;
	    }
	    if (ha > key) {
		goto L470;
	    }
	    key = ha;
	    goto L470;
L475:
	    ;
	}
/* Only one value found in interval, so it is already sorted */
	td += -2;
	goto L425;
/* Reorder interval [FIRST,LAST) such that entries before MID are gt KEY */
L470:
	mid = first;
	i__2 = last - 1;
	for (k = first; k <= i__2; ++k) {
	    if (a[k] <= key) {
		goto L450;
	    }
	    ha = a[mid];
	    a[mid] = a[k];
	    a[k] = ha;
	    hi = irn[mid];
	    irn[mid] = irn[k];
	    irn[k] = hi;
	    ++mid;
L450:
	    ;
	}
/* Both subintervals [FIRST,MID), [MID,LAST) are nonempty */
/* Stack the longest of the two subintervals first */
	if (mid - first >= last - mid) {
	    todo[td + 1] = last;
	    todo[td] = mid;
	    todo[td - 1] = mid;
/*          TODO(TD-1) = FIRST */
	} else {
	    todo[td + 1] = mid;
	    todo[td] = first;
	    todo[td - 1] = last;
	    todo[td - 2] = mid;
	}
	td += 2;
L425:
	if (td == 0) {
	    goto L400;
	}
/* There is still work to be done */
	if (todo[td - 1] - todo[td - 2] >= 15) {
	    goto L500;
	}
/* Next interval is already short enough for straightforward insertion */
	td += -2;
	goto L425;
/* Complete sorting with straightforward insertion */
L400:
	i__2 = ipj + len - 1;
	for (r__ = ipj + 1; r__ <= i__2; ++r__) {
	    if (a[r__ - 1] < a[r__]) {
		ha = a[r__];
		hi = irn[r__];
		a[r__] = a[r__ - 1];
		irn[r__] = irn[r__ - 1];
		i__3 = ipj + 1;
		for (s = r__ - 1; s >= i__3; --s) {
		    if (a[s - 1] < ha) {
			a[s] = a[s - 1];
			irn[s] = irn[s - 1];
		    } else {
			a[s] = ha;
			irn[s] = hi;
			goto L200;
		    }
/* L300: */
		}
		a[ipj] = ha;
		irn[ipj] = hi;
	    }
L200:
	    ;
	}
L100:
	;
    }
    return 0;
}